

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  long in_RDI;
  int c;
  uint b;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint uVar3;
  
  do {
    if (*(int *)(in_RDI + 0x482c) == 0) {
      bVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      uVar3 = (uint)bVar1;
    }
    else {
      uVar3 = 0;
    }
    in_stack_ffffffffffffffec = uVar3;
    if (uVar3 == 0xff) {
      sVar2 = stbi__get8((stbi__context *)CONCAT44(0xff,in_stack_ffffffffffffffe8));
      while (sVar2 == 0xff) {
        sVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      }
      if (sVar2 != '\0') {
        *(stbi_uc *)(in_RDI + 0x4828) = sVar2;
        *(undefined4 *)(in_RDI + 0x482c) = 1;
        return;
      }
    }
    *(uint *)(in_RDI + 0x4820) =
         uVar3 << (0x18U - (char)*(undefined4 *)(in_RDI + 0x4824) & 0x1f) |
         *(uint *)(in_RDI + 0x4820);
    *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) + 8;
    if (0x18 < *(int *)(in_RDI + 0x4824)) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}